

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O0

void re2::RE2FullMatchN(void)

{
  bool bVar1;
  ostream *poVar2;
  Arg *local_13b8;
  LogMessage local_13b0;
  RE2 local_1230;
  StringPiece local_1150;
  LogMessage local_1140;
  LogMessage local_fc0;
  LogMessage local_e40;
  RE2 local_cc0;
  StringPiece local_be0;
  Arg local_bd0;
  string local_bc0 [8];
  string s;
  LogMessage local_ba0;
  RE2 local_a20;
  StringPiece local_940;
  LogMessage local_930;
  LogMessage local_7b0;
  RE2 local_630;
  StringPiece local_550;
  Arg local_540;
  int local_52c;
  undefined1 local_528 [4];
  int i;
  RE2 local_3a8;
  StringPiece local_2c8;
  LogMessage local_2b8;
  RE2 local_128;
  StringPiece local_48;
  Arg *local_38;
  Arg *args [2];
  Arg argv [2];
  
  local_13b8 = (Arg *)(args + 1);
  do {
    RE2::Arg::Arg(local_13b8);
    local_13b8 = local_13b8 + 1;
  } while (local_13b8 != (Arg *)&argv[1].parser_);
  local_38 = (Arg *)(args + 1);
  args[0] = (Arg *)&argv[0].parser_;
  StringPiece::StringPiece(&local_48,"hello");
  RE2::RE2(&local_128,"h.*o");
  bVar1 = RE2::FullMatchN(&local_48,&local_128,&local_38,0);
  RE2::~RE2(&local_128);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_2b8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x2a9);
    poVar2 = LogMessage::stream(&local_2b8);
    std::operator<<(poVar2,"Check failed: RE2::FullMatchN(\"hello\", \"h.*o\", args, 0)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_2b8);
  }
  StringPiece::StringPiece(&local_2c8,"othello");
  RE2::RE2(&local_3a8,"h.*o");
  bVar1 = RE2::FullMatchN(&local_2c8,&local_3a8,&local_38,0);
  RE2::~RE2(&local_3a8);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_528,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x2aa);
    poVar2 = LogMessage::stream((LogMessage *)local_528);
    std::operator<<(poVar2,"Check failed: !(RE2::FullMatchN(\"othello\", \"h.*o\", args, 0))");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_528);
  }
  RE2::Arg::Arg(&local_540,&local_52c);
  args[1] = (Arg *)local_540.arg_;
  argv[0].arg_ = local_540.parser_;
  StringPiece::StringPiece(&local_550,"1001");
  RE2::RE2(&local_630,"(\\d+)");
  bVar1 = RE2::FullMatchN(&local_550,&local_630,&local_38,1);
  RE2::~RE2(&local_630);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_7b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x2af);
    poVar2 = LogMessage::stream(&local_7b0);
    std::operator<<(poVar2,"Check failed: RE2::FullMatchN(\"1001\", \"(\\\\d+)\", args, 1)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_7b0);
  }
  if (local_52c != 0x3e9) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_930,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x2b0);
    poVar2 = LogMessage::stream(&local_930);
    std::operator<<(poVar2,"Check failed: (1001) == (i)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_930);
  }
  StringPiece::StringPiece(&local_940,"three");
  RE2::RE2(&local_a20,"(\\d+)");
  bVar1 = RE2::FullMatchN(&local_940,&local_a20,&local_38,1);
  RE2::~RE2(&local_a20);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_ba0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x2b1);
    poVar2 = LogMessage::stream(&local_ba0);
    std::operator<<(poVar2,"Check failed: !(RE2::FullMatchN(\"three\", \"(\\\\d+)\", args, 1))");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_ba0);
  }
  std::__cxx11::string::string(local_bc0);
  RE2::Arg::Arg(&local_bd0,(string *)local_bc0);
  argv[0].parser_ = (Parser)local_bd0.arg_;
  argv[1].arg_ = local_bd0.parser_;
  StringPiece::StringPiece(&local_be0,"42:life");
  RE2::RE2(&local_cc0,"(\\d+):(\\w+)");
  bVar1 = RE2::FullMatchN(&local_be0,&local_cc0,&local_38,2);
  RE2::~RE2(&local_cc0);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_e40,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x2b6);
    poVar2 = LogMessage::stream(&local_e40);
    std::operator<<(poVar2,
                    "Check failed: RE2::FullMatchN(\"42:life\", \"(\\\\d+):(\\\\w+)\", args, 2)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_e40);
  }
  if (local_52c != 0x2a) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_fc0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x2b7);
    poVar2 = LogMessage::stream(&local_fc0);
    std::operator<<(poVar2,"Check failed: (42) == (i)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_fc0);
  }
  bVar1 = std::operator==("life",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_bc0);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1140,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x2b8);
    poVar2 = LogMessage::stream(&local_1140);
    std::operator<<(poVar2,"Check failed: (\"life\") == (s)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1140);
  }
  StringPiece::StringPiece(&local_1150,"hi1");
  RE2::RE2(&local_1230,"(\\w+)(1)");
  bVar1 = RE2::FullMatchN(&local_1150,&local_1230,&local_38,2);
  RE2::~RE2(&local_1230);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_13b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x2b9);
    poVar2 = LogMessage::stream(&local_13b0);
    std::operator<<(poVar2,"Check failed: !(RE2::FullMatchN(\"hi1\", \"(\\\\w+)(1)\", args, 2))");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_13b0);
  }
  std::__cxx11::string::~string(local_bc0);
  return;
}

Assistant:

TEST(RE2, FullMatchN) {
  RE2::Arg argv[2];
  const RE2::Arg* const args[2] = { &argv[0], &argv[1] };

  // 0 arg
  EXPECT_TRUE(RE2::FullMatchN("hello", "h.*o", args, 0));
  EXPECT_FALSE(RE2::FullMatchN("othello", "h.*o", args, 0));

  // 1 arg
  int i;
  argv[0] = &i;
  EXPECT_TRUE(RE2::FullMatchN("1001", "(\\d+)", args, 1));
  EXPECT_EQ(1001, i);
  EXPECT_FALSE(RE2::FullMatchN("three", "(\\d+)", args, 1));

  // Multi-arg
  string s;
  argv[1] = &s;
  EXPECT_TRUE(RE2::FullMatchN("42:life", "(\\d+):(\\w+)", args, 2));
  EXPECT_EQ(42, i);
  EXPECT_EQ("life", s);
  EXPECT_FALSE(RE2::FullMatchN("hi1", "(\\w+)(1)", args, 2));
}